

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

void __thiscall clip_ctx::~clip_ctx(clip_ctx *this)

{
  ggml_backend_free(this->backend);
  if (this->backend != this->backend_cpu) {
    ggml_backend_free();
  }
  std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::~unique_ptr(&this->sched);
  std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr(&this->buf);
  std::_Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::
  ~_Vector_base(&(this->backend_buft).
                 super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
               );
  std::_Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>::~_Vector_base
            (&(this->backend_ptrs).
              super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->buf_compute_meta).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr(&this->ctx_data);
  std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr(&this->ctx_gguf);
  clip_vision_model::~clip_vision_model(&this->vision_model);
  return;
}

Assistant:

~clip_ctx() {
        ggml_backend_free(backend);
        if (backend != backend_cpu) {
            ggml_backend_free(backend_cpu);
        }
    }